

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O2

int uv__inotify_fork(uv_loop_t *loop,void *old_watchers)

{
  void **ppvVar1;
  uv_fs_event_t *handle;
  long *plVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  int iVar7;
  watcher_list *pwVar8;
  char *pcVar9;
  watcher_list *w;
  watcher_list *pwVar10;
  bool bVar11;
  watcher_list tmp_watcher_list;
  long *local_98;
  long *local_90;
  uv_loop_t *local_88;
  undefined1 local_80 [80];
  
  local_80._0_8_ = old_watchers;
  if (old_watchers == (void *)0x0) {
LAB_00402924:
    iVar7 = 0;
  }
  else {
    loop->inotify_watchers = old_watchers;
    local_80._40_8_ = local_80 + 0x28;
    local_80._48_8_ = local_80 + 0x28;
    pwVar8 = (watcher_list *)local_80;
    pwVar10 = (watcher_list *)0x0;
    do {
      w = pwVar10;
      pwVar8 = (pwVar8->entry).rbe_left;
      pwVar10 = pwVar8;
      local_88 = loop;
    } while (pwVar8 != (watcher_list *)0x0);
    while (uVar6 = local_80._40_8_, w != (watcher_list *)0x0) {
      pwVar8 = (w->entry).rbe_right;
      if (pwVar8 == (watcher_list *)0x0) {
        pwVar10 = (w->entry).rbe_parent;
        pwVar8 = w;
        if ((pwVar10 == (watcher_list *)0x0) || ((pwVar10->entry).rbe_left != w)) {
          do {
            pwVar10 = (pwVar8->entry).rbe_parent;
            if (pwVar10 == (watcher_list *)0x0) {
              pwVar10 = (watcher_list *)0x0;
              break;
            }
            bVar11 = pwVar8 == (pwVar10->entry).rbe_right;
            pwVar8 = pwVar10;
          } while (bVar11);
        }
      }
      else {
        do {
          pwVar10 = pwVar8;
          pwVar8 = (pwVar10->entry).rbe_left;
        } while (pwVar8 != (watcher_list *)0x0);
      }
      w->iterating = 1;
      ppvVar1 = w->watchers;
      plVar2 = (long *)w->watchers[0];
      local_98 = (long *)&local_98;
      if (ppvVar1 != (void **)plVar2) {
        local_90 = (long *)w->watchers[1];
        *local_90 = (long)&local_98;
        plVar3 = (long *)plVar2[1];
        w->watchers[1] = plVar3;
        *plVar3 = (long)ppvVar1;
        local_98 = plVar2;
      }
      local_98[1] = (long)&local_98;
      while (plVar2 = local_98, &local_98 != (long **)local_98) {
        pcVar9 = uv__strdup((char *)local_98[-2]);
        if (pcVar9 == (char *)0x0) {
          __assert_fail("tmp_path != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/linux-inotify.c"
                        ,0x94,"int uv__inotify_fork(uv_loop_t *, void *)");
        }
        lVar4 = *plVar2;
        *(long *)plVar2[1] = lVar4;
        *(long *)(lVar4 + 8) = plVar2[1];
        *plVar2 = (long)ppvVar1;
        puVar5 = (undefined8 *)w->watchers[1];
        plVar2[1] = (long)puVar5;
        *puVar5 = plVar2;
        w->watchers[1] = plVar2;
        uv_fs_event_stop((uv_fs_event_t *)(plVar2 + -0xe));
        *plVar2 = (long)(local_80 + 0x28);
        plVar2[1] = local_80._48_8_;
        *(long **)local_80._48_8_ = plVar2;
        local_80._48_8_ = plVar2;
        plVar2[-2] = (long)pcVar9;
      }
      w->iterating = 0;
      maybe_free_watcher_list(w,local_88);
      w = pwVar10;
    }
    local_98 = (long *)&local_98;
    if (local_80 + 0x28 != (undefined1 *)local_80._40_8_) {
      local_90 = (long *)local_80._48_8_;
      *(long ***)local_80._48_8_ = &local_98;
      local_98 = (long *)uVar6;
      local_80._48_8_ = *(long *)(uVar6 + 8);
      *(undefined1 **)local_80._48_8_ = local_80 + 0x28;
    }
    local_98[1] = (long)&local_98;
    do {
      if (&local_98 == (long **)local_98) goto LAB_00402924;
      lVar4 = *local_98;
      *(long *)local_98[1] = lVar4;
      *(long *)(lVar4 + 8) = local_98[1];
      handle = (uv_fs_event_t *)(local_98 + -0xe);
      pcVar9 = (char *)local_98[-2];
      plVar2 = local_98 + -1;
      local_98[-2] = 0;
      iVar7 = uv_fs_event_start(handle,(uv_fs_event_cb)*plVar2,pcVar9,(uint)lVar4);
      uv__free(pcVar9);
    } while (iVar7 == 0);
  }
  return iVar7;
}

Assistant:

int uv__inotify_fork(uv_loop_t* loop, void* old_watchers) {
  /* Open the inotify_fd, and re-arm all the inotify watchers. */
  int err;
  struct watcher_list* tmp_watcher_list_iter;
  struct watcher_list* watcher_list;
  struct watcher_list tmp_watcher_list;
  QUEUE queue;
  QUEUE* q;
  uv_fs_event_t* handle;
  char* tmp_path;

  if (old_watchers != NULL) {
    /* We must restore the old watcher list to be able to close items
     * out of it.
     */
    loop->inotify_watchers = old_watchers;

    QUEUE_INIT(&tmp_watcher_list.watchers);
    /* Note that the queue we use is shared with the start and stop()
     * functions, making QUEUE_FOREACH unsafe to use. So we use the
     * QUEUE_MOVE trick to safely iterate. Also don't free the watcher
     * list until we're done iterating. c.f. uv__inotify_read.
     */
    RB_FOREACH_SAFE(watcher_list, watcher_root,
                    CAST(&old_watchers), tmp_watcher_list_iter) {
      watcher_list->iterating = 1;
      QUEUE_MOVE(&watcher_list->watchers, &queue);
      while (!QUEUE_EMPTY(&queue)) {
        q = QUEUE_HEAD(&queue);
        handle = QUEUE_DATA(q, uv_fs_event_t, watchers);
        /* It's critical to keep a copy of path here, because it
         * will be set to NULL by stop() and then deallocated by
         * maybe_free_watcher_list
         */
        tmp_path = uv__strdup(handle->path);
        assert(tmp_path != NULL);
        QUEUE_REMOVE(q);
        QUEUE_INSERT_TAIL(&watcher_list->watchers, q);
        uv_fs_event_stop(handle);

        QUEUE_INSERT_TAIL(&tmp_watcher_list.watchers, &handle->watchers);
        handle->path = tmp_path;
      }
      watcher_list->iterating = 0;
      maybe_free_watcher_list(watcher_list, loop);
    }

    QUEUE_MOVE(&tmp_watcher_list.watchers, &queue);
    while (!QUEUE_EMPTY(&queue)) {
        q = QUEUE_HEAD(&queue);
        QUEUE_REMOVE(q);
        handle = QUEUE_DATA(q, uv_fs_event_t, watchers);
        tmp_path = handle->path;
        handle->path = NULL;
        err = uv_fs_event_start(handle, handle->cb, tmp_path, 0);
        uv__free(tmp_path);
        if (err)
          return err;
    }
  }

  return 0;
}